

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O2

void __thiscall Refal2::CQualifierParser::addWord(CQualifierParser *this)

{
  CQualifierBuilder *this_00;
  int *piVar1;
  char cVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &this->builder;
  uVar3 = 0;
  do {
    if ((this->token).word._M_string_length <= uVar3) {
      this->afterRightParen = false;
      return;
    }
    cVar2 = (this->token).word._M_dataplus._M_p[uVar3];
    switch(cVar2) {
    case 'B':
switchD_00132a3e_caseD_62:
      CQualifierBuilder::AddB(this_00);
      break;
    case 'C':
    case 'E':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'M':
switchD_00132a3e_caseD_63:
      piVar1 = &(this->token).position;
      *piVar1 = *piVar1 + (int)uVar3;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_88,'\x01');
      std::operator+(&local_68,"primary qualifier `",&local_88);
      std::operator+(&local_48,&local_68,"` does not exist");
      error(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      return;
    case 'D':
switchD_00132a3e_caseD_64:
      CQualifierBuilder::AddD(this_00);
      break;
    case 'F':
switchD_00132a3e_caseD_66:
      CQualifierBuilder::AddF(this_00);
      break;
    case 'L':
switchD_00132a3e_caseD_6c:
      CQualifierBuilder::AddL(this_00);
      break;
    case 'N':
switchD_00132a3e_caseD_6e:
      CQualifierBuilder::AddN(this_00);
      break;
    case 'O':
switchD_00132a3e_caseD_6f:
      CQualifierBuilder::AddO(this_00);
      break;
    default:
      switch(cVar2) {
      case 'b':
        goto switchD_00132a3e_caseD_62;
      case 'c':
      case 'e':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'm':
        goto switchD_00132a3e_caseD_63;
      case 'd':
        goto switchD_00132a3e_caseD_64;
      case 'f':
        goto switchD_00132a3e_caseD_66;
      case 'l':
        goto switchD_00132a3e_caseD_6c;
      case 'n':
        goto switchD_00132a3e_caseD_6e;
      case 'o':
        goto switchD_00132a3e_caseD_6f;
      default:
        if (cVar2 == 'S') {
LAB_00132a68:
          CQualifierBuilder::AddS(this_00);
        }
        else {
          if ((cVar2 != 'W') && (cVar2 != 'w')) {
            if (cVar2 != 's') goto switchD_00132a3e_caseD_63;
            goto LAB_00132a68;
          }
          CQualifierBuilder::AddW(this_00);
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void CQualifierParser::addWord()
{
	for( std::string::size_type i = 0; i < token.word.length(); i++ ) {
		switch( token.word[i] ) {
			case 's': case 'S':
				builder.AddS();
				break;
			case 'f': case 'F':
				builder.AddF();
				break;
			case 'n': case 'N':
				builder.AddN();
				break;
			case 'o': case 'O':
				builder.AddO();
				break;
			case 'l': case 'L':
				builder.AddL();
				break;
			case 'd': case 'D':
				builder.AddD();
				break;
			case 'w': case 'W':
				builder.AddW();
				break;
			case 'b': case 'B':
				builder.AddB();
				break;
			default:
				token.position += i;
				error( "primary qualifier `" +
					std::string( 1, token.word[i] ) + "` does not exist" );
				return;
		}
	}
	afterRightParen = false;
}